

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cswMan.c
# Opt level: O0

void Csw_ManStop(Csw_Man_t *p)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  double local_70;
  double local_60;
  double local_50;
  double local_40;
  int nNodesEnd;
  int nNodesBeg;
  Csw_Man_t *p_local;
  
  if (p->fVerbose != 0) {
    uVar2 = Aig_ManNodeNum(p->pManAig);
    uVar3 = Aig_ManNodeNum(p->pManRes);
    uVar1 = p->nNodesTried;
    uVar4 = Csw_TableCountCuts(p);
    printf("Beg = %7d.  End = %7d.  (%6.2f %%)  Try = %7d.  Cuts = %8d.\n",
           ((double)(int)(uVar2 - uVar3) * 100.0) / (double)(int)uVar2,(ulong)uVar2,(ulong)uVar3,
           (ulong)uVar1,(ulong)uVar4);
    printf("Triv0 = %6d.  Triv1 = %6d.  Triv2 = %6d.  Cut-replace = %6d.\n",
           (ulong)(uint)p->nNodesTriv0,(ulong)(uint)p->nNodesTriv1,(ulong)(uint)p->nNodesTriv2,
           (ulong)(uint)p->nNodesCuts);
    Abc_Print(1,"%s =","Cuts    ");
    if (((double)p->timeTotal != 0.0) || (NAN((double)p->timeTotal))) {
      local_40 = ((double)p->timeCuts * 100.0) / (double)p->timeTotal;
    }
    else {
      local_40 = 0.0;
    }
    Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeCuts * 1.0) / 1000000.0,local_40);
    Abc_Print(1,"%s =","Hashing ");
    if (((double)p->timeTotal != 0.0) || (NAN((double)p->timeTotal))) {
      local_50 = ((double)p->timeHash * 100.0) / (double)p->timeTotal;
    }
    else {
      local_50 = 0.0;
    }
    Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeHash * 1.0) / 1000000.0,local_50);
    Abc_Print(1,"%s =","Other   ");
    if (((double)p->timeTotal != 0.0) || (NAN((double)p->timeTotal))) {
      local_60 = ((double)p->timeOther * 100.0) / (double)p->timeTotal;
    }
    else {
      local_60 = 0.0;
    }
    Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeOther * 1.0) / 1000000.0,local_60);
    Abc_Print(1,"%s =","TOTAL   ");
    if (((double)p->timeTotal != 0.0) || (NAN((double)p->timeTotal))) {
      local_70 = ((double)p->timeTotal * 100.0) / (double)p->timeTotal;
    }
    else {
      local_70 = 0.0;
    }
    Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeTotal * 1.0) / 1000000.0,local_70);
  }
  if (p->puTemp[0] != (uint *)0x0) {
    free(p->puTemp[0]);
    p->puTemp[0] = (uint *)0x0;
  }
  Aig_MmFixedStop(p->pMemCuts,0);
  if (p->pnRefs != (int *)0x0) {
    free(p->pnRefs);
    p->pnRefs = (int *)0x0;
  }
  if (p->pEquiv != (Aig_Obj_t **)0x0) {
    free(p->pEquiv);
    p->pEquiv = (Aig_Obj_t **)0x0;
  }
  if (p->pCuts != (Csw_Cut_t **)0x0) {
    free(p->pCuts);
    p->pCuts = (Csw_Cut_t **)0x0;
  }
  if (p->pTable != (Csw_Cut_t **)0x0) {
    free(p->pTable);
    p->pTable = (Csw_Cut_t **)0x0;
  }
  if (p != (Csw_Man_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Csw_ManStop( Csw_Man_t * p )
{
    if ( p->fVerbose )
    {
        int nNodesBeg = Aig_ManNodeNum(p->pManAig);
        int nNodesEnd = Aig_ManNodeNum(p->pManRes);
        printf( "Beg = %7d.  End = %7d.  (%6.2f %%)  Try = %7d.  Cuts = %8d.\n", 
            nNodesBeg, nNodesEnd, 100.0*(nNodesBeg-nNodesEnd)/nNodesBeg,
            p->nNodesTried, Csw_TableCountCuts( p ) );
        printf( "Triv0 = %6d.  Triv1 = %6d.  Triv2 = %6d.  Cut-replace = %6d.\n", 
            p->nNodesTriv0, p->nNodesTriv1, p->nNodesTriv2, p->nNodesCuts );
        ABC_PRTP( "Cuts    ", p->timeCuts,     p->timeTotal );
        ABC_PRTP( "Hashing ", p->timeHash,     p->timeTotal );
        ABC_PRTP( "Other   ", p->timeOther,    p->timeTotal );
        ABC_PRTP( "TOTAL   ", p->timeTotal,    p->timeTotal );
    }
    ABC_FREE( p->puTemp[0] );
    Aig_MmFixedStop( p->pMemCuts, 0 );
    ABC_FREE( p->pnRefs );
    ABC_FREE( p->pEquiv );
    ABC_FREE( p->pCuts );
    ABC_FREE( p->pTable );
    ABC_FREE( p );
}